

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_crease(REF_GRID ref_grid,REF_INT node,REF_DBL *dot_prod)

{
  REF_INT RVar1;
  REF_NODE pRVar2;
  REF_CELL pRVar3;
  REF_ADJ pRVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  uint uVar9;
  REF_ADJ_ITEM pRVar10;
  long lVar11;
  long lVar12;
  undefined8 uVar13;
  REF_STATUS RVar14;
  ulong uVar15;
  char *pcVar16;
  double dVar17;
  double dVar18;
  REF_DBL area_sign1;
  REF_DBL area_sign0;
  REF_DBL n1 [3];
  REF_DBL n0 [3];
  REF_DBL uv [2];
  REF_DBL s [3];
  REF_DBL r [3];
  REF_INT nodes [27];
  int local_188;
  int local_178;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_118;
  double local_110;
  double local_108;
  REF_DBL local_f8 [2];
  REF_DBL local_e8 [4];
  REF_DBL local_c8 [4];
  REF_INT local_a8 [30];
  
  pRVar2 = ref_grid->node;
  pRVar3 = ref_grid->cell[3];
  *dot_prod = 1.0;
  RVar14 = 0;
  if ((((-1 < node) && (node < pRVar2->max)) && (-1 < pRVar2->global[(uint)node])) &&
     ((pRVar4 = pRVar3->ref_adj, RVar14 = 0, node < pRVar4->nnode &&
      (lVar11 = (long)pRVar4->first[(uint)node], lVar11 != -1)))) {
    uVar9 = ref_cell_nodes(ref_grid->cell[3],pRVar4->item[lVar11].ref,local_a8);
    while (uVar9 == 0) {
      uVar9 = ref_geom_tri_centroid(ref_grid,local_a8,local_f8);
      if (uVar9 != 0) {
        uVar13 = 0x702;
LAB_0016cfe3:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               uVar13,"ref_geom_crease",(ulong)uVar9,"tri cent");
        return uVar9;
      }
      RVar1 = local_a8[pRVar3->node_per];
      uVar9 = ref_geom_face_rsn(ref_grid->geom,RVar1,local_f8,local_c8,local_e8,&local_118);
      if (uVar9 != 0) {
        uVar15 = (ulong)uVar9;
        pcVar16 = "rsn";
        uVar13 = 0x704;
        goto LAB_0016ccdc;
      }
      uVar9 = ref_geom_uv_area_sign(ref_grid,RVar1,&local_140);
      dVar8 = local_108;
      dVar7 = local_110;
      dVar6 = local_118;
      dVar5 = local_140;
      if (uVar9 != 0) {
        uVar15 = (ulong)uVar9;
        pcVar16 = "a sign";
        uVar13 = 0x705;
        goto LAB_0016ccdc;
      }
      pRVar4 = pRVar3->ref_adj;
      if ((node < pRVar4->nnode) && (lVar12 = (long)pRVar4->first[(uint)node], lVar12 != -1)) {
        pRVar10 = pRVar4->item;
        do {
          uVar9 = ref_cell_nodes(ref_grid->cell[3],pRVar10[lVar12].ref,local_a8);
          if (uVar9 != 0) {
            uVar15 = (ulong)uVar9;
            pcVar16 = "tri list for edge";
            uVar13 = 0x708;
            goto LAB_0016ccdc;
          }
          uVar9 = ref_geom_tri_centroid(ref_grid,local_a8,local_f8);
          if (uVar9 != 0) {
            uVar13 = 0x709;
            goto LAB_0016cfe3;
          }
          RVar1 = local_a8[pRVar3->node_per];
          uVar9 = ref_geom_face_rsn(ref_grid->geom,RVar1,local_f8,local_c8,local_e8,&local_138);
          if (uVar9 != 0) {
            uVar15 = (ulong)uVar9;
            pcVar16 = "rsn";
            uVar13 = 0x70b;
            goto LAB_0016ccdc;
          }
          uVar9 = ref_geom_uv_area_sign(ref_grid,RVar1,&local_148);
          if (uVar9 != 0) {
            uVar15 = (ulong)uVar9;
            pcVar16 = "a sign";
            uVar13 = 0x70c;
            goto LAB_0016ccdc;
          }
          dVar18 = (local_128 * dVar8 + local_138 * dVar6 + local_130 * dVar7) * local_148 * dVar5;
          dVar17 = *dot_prod;
          if (dVar18 <= *dot_prod) {
            dVar17 = dVar18;
          }
          *dot_prod = dVar17;
          pRVar10 = pRVar3->ref_adj->item;
          local_178 = (int)lVar12;
          lVar12 = (long)pRVar10[local_178].next;
        } while (lVar12 != -1);
      }
      else {
        pRVar10 = pRVar4->item;
      }
      local_188 = (int)lVar11;
      lVar11 = (long)pRVar10[local_188].next;
      if (lVar11 == -1) {
        return 0;
      }
      uVar9 = ref_cell_nodes(ref_grid->cell[3],pRVar10[lVar11].ref,local_a8);
    }
    uVar15 = (ulong)uVar9;
    pcVar16 = "tri list for edge";
    uVar13 = 0x701;
LAB_0016ccdc:
    RVar14 = (REF_STATUS)uVar15;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar13,
           "ref_geom_crease",uVar15,pcVar16);
  }
  return RVar14;
}

Assistant:

REF_FCN REF_STATUS ref_geom_crease(REF_GRID ref_grid, REF_INT node,
                                   REF_DBL *dot_prod) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item0, item1, cell0, cell1, id;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL uv[2];
  REF_DBL r[3], s[3];
  REF_DBL n0[3], area_sign0;
  REF_DBL n1[3], area_sign1;

  *dot_prod = 1.0;

  if (!ref_node_valid(ref_node, node)) {
    return REF_SUCCESS;
  }

  each_ref_cell_having_node(ref_cell, node, item0, cell0) {
    RSS(ref_cell_nodes(ref_grid_tri(ref_grid), cell0, nodes),
        "tri list for edge");
    RSS(ref_geom_tri_centroid(ref_grid, nodes, uv), "tri cent");
    id = nodes[ref_cell_node_per(ref_cell)];
    RSS(ref_geom_face_rsn(ref_grid_geom(ref_grid), id, uv, r, s, n0), "rsn");
    RSS(ref_geom_uv_area_sign(ref_grid, id, &area_sign0), "a sign");
    each_ref_cell_having_node(ref_cell, node, item1, cell1) {
      RSS(ref_cell_nodes(ref_grid_tri(ref_grid), cell1, nodes),
          "tri list for edge");
      RSS(ref_geom_tri_centroid(ref_grid, nodes, uv), "tri cent");
      id = nodes[ref_cell_node_per(ref_cell)];
      RSS(ref_geom_face_rsn(ref_grid_geom(ref_grid), id, uv, r, s, n1), "rsn");
      RSS(ref_geom_uv_area_sign(ref_grid, id, &area_sign1), "a sign");

      *dot_prod =
          MIN(*dot_prod, area_sign0 * area_sign1 * ref_math_dot(n0, n1));
    }
  }

  return REF_SUCCESS;
}